

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int a;
  int b;
  stbi__context *s;
  byte *pbVar3;
  byte bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  stbi_uc sVar11;
  uint uVar12;
  stbi__uint32 sVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  stbi_uc *psVar17;
  void *pvVar18;
  stbi_uc *psVar19;
  byte bVar20;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  int *piVar28;
  int iVar29;
  ulong uVar30;
  ushort uVar31;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar32 [32];
  
  s = z->s;
  uVar12 = stbi__get16be(s);
  if (uVar12 < 0xb) {
LAB_0010d074:
    stbi__g_failure_reason = "bad SOF len";
  }
  else {
    psVar17 = s->img_buffer;
    if (psVar17 < s->img_buffer_end) {
      s->img_buffer = psVar17 + 1;
      sVar11 = *psVar17;
LAB_0010d0f4:
      if (sVar11 == '\b') {
        sVar13 = stbi__get16be(s);
        s->img_y = sVar13;
        if (sVar13 == 0) {
          stbi__g_failure_reason = "no header height";
          return 0;
        }
        sVar13 = stbi__get16be(s);
        s->img_x = sVar13;
        if (sVar13 == 0) {
          stbi__g_failure_reason = "0 width";
          return 0;
        }
        pbVar3 = s->img_buffer;
        psVar17 = s->img_buffer_end;
        if (pbVar3 < psVar17) {
          psVar19 = pbVar3 + 1;
          s->img_buffer = psVar19;
          bVar20 = *pbVar3;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_0010d7d1;
          psVar17 = s->buffer_start;
          iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
          if (iVar16 == 0) {
            s->read_from_callbacks = 0;
            psVar17 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            bVar20 = 0;
          }
          else {
            bVar20 = *psVar17;
            psVar17 = psVar17 + iVar16;
          }
          psVar19 = s->buffer_start + 1;
          s->img_buffer_end = psVar17;
          s->img_buffer = psVar19;
        }
        if (4 < bVar20) {
LAB_0010d7d1:
          stbi__g_failure_reason = "bad component count";
          return 0;
        }
        uVar30 = (ulong)bVar20;
        if ((0x1aU >> (bVar20 & 0x1f) & 1) == 0) goto LAB_0010d7d1;
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar36 = vpbroadcastq_avx512f(ZEXT816(8));
        s->img_n = (uint)bVar20;
        uVar22 = (ulong)(bVar20 + 7 & 0xf8);
        auVar37 = vpbroadcastq_avx512f();
        auVar38 = vpbroadcastq_avx512f();
        do {
          auVar39._8_8_ = 0x60;
          auVar39._0_8_ = 0x60;
          auVar39._16_8_ = 0x60;
          auVar39._24_8_ = 0x60;
          auVar39._32_8_ = 0x60;
          auVar39._40_8_ = 0x60;
          auVar39._48_8_ = 0x60;
          auVar39._56_8_ = 0x60;
          auVar39 = vpmullq_avx512dq(auVar35,auVar39);
          uVar8 = vpcmpuq_avx512f(auVar35,auVar37,2);
          auVar35 = vpaddq_avx512f(auVar35,auVar36);
          uVar22 = uVar22 - 8;
          auVar39 = vpaddq_avx512f(auVar38,auVar39);
          vpscatterqq_avx512f(ZEXT864(0x30) + auVar39,uVar8,ZEXT1664((undefined1  [16])0x0));
          vpscatterqq_avx512f(ZEXT864(0x48) + auVar39,uVar8,ZEXT1664((undefined1  [16])0x0));
        } while (uVar22 != 0);
        if (uVar12 == (uint)bVar20 * 3 + 8) {
          psVar1 = s->buffer_start + 1;
          psVar2 = s->buffer_start;
          piVar28 = &z->img_comp[0].tq;
          lVar27 = 0;
          z->rgb = 0;
          auVar35 = vmovdqu64_avx512f(auVar38);
          do {
            iVar16 = (int)uVar30;
            if (psVar19 < psVar17) {
              s->img_buffer = psVar19 + 1;
              bVar20 = *psVar19;
              psVar19 = psVar19 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar20 = 0;
            }
            else {
              iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
              if (iVar16 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar20 = 0;
                psVar17 = psVar1;
              }
              else {
                bVar20 = *psVar2;
                psVar17 = psVar2 + iVar16;
              }
              s->img_buffer_end = psVar17;
              s->img_buffer = psVar1;
              iVar16 = s->img_n;
              psVar19 = psVar1;
            }
            ((anon_struct_96_18_0d0905d3 *)(piVar28 + -3))->id = (uint)bVar20;
            if ((iVar16 == 3) && (bVar20 == "RGB"[lVar27])) {
              z->rgb = z->rgb + 1;
            }
            if (psVar19 < psVar17) {
              s->img_buffer = psVar19 + 1;
              bVar20 = *psVar19;
              psVar19 = psVar19 + 1;
            }
            else {
              if (s->read_from_callbacks == 0) {
                piVar28[-2] = 0;
                goto LAB_0010d7f4;
              }
              iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
              if (iVar16 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar20 = 0;
                psVar17 = psVar1;
              }
              else {
                bVar20 = *psVar2;
                psVar17 = psVar2 + iVar16;
              }
              s->img_buffer_end = psVar17;
              s->img_buffer = psVar1;
              psVar19 = psVar1;
            }
            piVar28[-2] = (uint)(bVar20 >> 4);
            if ((byte)(bVar20 + 0xb0) < 0xc0) {
LAB_0010d7f4:
              stbi__g_failure_reason = "bad H";
              return 0;
            }
            piVar28[-1] = bVar20 & 0xf;
            if ((bVar20 & 0xf) - 5 < 0xfffffffc) {
              stbi__g_failure_reason = "bad V";
              return 0;
            }
            if (psVar19 < psVar17) {
              s->img_buffer = psVar19 + 1;
              bVar20 = *psVar19;
              psVar19 = psVar19 + 1;
LAB_0010d423:
              *piVar28 = (uint)bVar20;
              if (3 < bVar20) {
                stbi__g_failure_reason = "bad TQ";
                return 0;
              }
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                if (iVar16 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar20 = 0;
                  psVar17 = psVar1;
                }
                else {
                  bVar20 = *psVar2;
                  psVar17 = psVar2 + iVar16;
                }
                s->img_buffer_end = psVar17;
                s->img_buffer = psVar1;
                psVar19 = psVar1;
                goto LAB_0010d423;
              }
              *piVar28 = 0;
            }
            iVar16 = s->img_n;
            uVar30 = (ulong)iVar16;
            lVar27 = lVar27 + 1;
            piVar28 = piVar28 + 0x18;
          } while (lVar27 < (long)uVar30);
          if (scan != 0) {
            return 1;
          }
          sVar13 = s->img_x;
          uVar12 = s->img_y;
          uVar22 = (ulong)uVar12;
          iVar14 = stbi__mad3sizes_valid(sVar13,uVar12,iVar16,0);
          if (iVar14 == 0) {
            stbi__g_failure_reason = "too large";
            return 0;
          }
          uVar24 = 1;
          uVar23 = 1;
          if (0 < iVar16) {
            auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar39 = vpbroadcastq_avx512f(ZEXT816(0x10));
            auVar40 = vpbroadcastq_avx512f(ZEXT816(0x60));
            auVar35 = vmovdqu64_avx512f(auVar35);
            uVar23 = (ulong)(iVar16 + 0xfU & 0xfffffff0);
            auVar41 = vpbroadcastq_avx512f();
            auVar42 = vmovdqa64_avx512f(auVar36);
            do {
              auVar43 = vmovdqa64_avx512f(auVar42);
              auVar42 = vpmullq_avx512dq(auVar37,auVar40);
              auVar44 = vmovdqa64_avx512f(auVar36);
              auVar36 = vpmullq_avx512dq(auVar38,auVar40);
              uVar24 = vpcmpuq_avx512f(auVar37,auVar41,2);
              uVar9 = vpcmpuq_avx512f(auVar38,auVar41,2);
              auVar38 = vpaddq_avx512f(auVar38,auVar39);
              auVar37 = vpaddq_avx512f(auVar37,auVar39);
              uVar23 = uVar23 - 0x10;
              vpaddq_avx512f(auVar35,auVar42);
              vpaddq_avx512f(auVar35,auVar36);
              auVar32 = vpgatherqd_avx512f(CONCAT44(_DAT_00000009,_DAT_00000005));
              bVar20 = (byte)uVar24;
              auVar33._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar32._4_4_;
              auVar33._0_4_ = (uint)(bVar20 & 1) * auVar32._0_4_;
              auVar33._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar32._8_4_;
              auVar33._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar32._12_4_;
              auVar33._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar32._16_4_;
              auVar33._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar32._20_4_;
              auVar33._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar32._24_4_;
              auVar33._28_4_ = (uint)(byte)(uVar24 >> 7) * auVar32._28_4_;
              auVar32 = vpgatherqd_avx512f(*(undefined8 *)(uVar22 + 4));
              bVar4 = (byte)uVar9;
              auVar36 = vinserti64x4_avx512f
                                  (ZEXT3264(CONCAT428((uint)(byte)(uVar9 >> 7) * auVar32._28_4_,
                                                      CONCAT424((uint)((byte)(uVar9 >> 6) & 1) *
                                                                auVar32._24_4_,
                                                                CONCAT420((uint)((byte)(uVar9 >> 5)
                                                                                & 1) *
                                                                          auVar32._20_4_,
                                                                          CONCAT416((uint)((byte)(
                                                  uVar9 >> 4) & 1) * auVar32._16_4_,
                                                  CONCAT412((uint)((byte)(uVar9 >> 3) & 1) *
                                                            auVar32._12_4_,
                                                            CONCAT48((uint)((byte)(uVar9 >> 2) & 1)
                                                                     * auVar32._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar9 >>
                                                                                           1) & 1) *
                                                                              auVar32._4_4_,
                                                                              (uint)(bVar4 & 1) *
                                                                              auVar32._0_4_)))))))),
                                   auVar33,1);
              auVar32 = vpgatherqd_avx512f(CONCAT44(uRam000000000000000d,_DAT_00000009));
              auVar34._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar32._4_4_;
              auVar34._0_4_ = (uint)(bVar20 & 1) * auVar32._0_4_;
              auVar34._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar32._8_4_;
              auVar34._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar32._12_4_;
              auVar34._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar32._16_4_;
              auVar34._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar32._20_4_;
              auVar34._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar32._24_4_;
              auVar34._28_4_ = (uint)(byte)(uVar24 >> 7) * auVar32._28_4_;
              auVar42 = vpmaxsd_avx512f(auVar36,auVar43);
              auVar32 = vpgatherqd_avx512f(*(undefined8 *)(uVar22 + 8));
              auVar36 = vinserti64x4_avx512f
                                  (ZEXT3264(CONCAT428((uint)(byte)(uVar9 >> 7) * auVar32._28_4_,
                                                      CONCAT424((uint)((byte)(uVar9 >> 6) & 1) *
                                                                auVar32._24_4_,
                                                                CONCAT420((uint)((byte)(uVar9 >> 5)
                                                                                & 1) *
                                                                          auVar32._20_4_,
                                                                          CONCAT416((uint)((byte)(
                                                  uVar9 >> 4) & 1) * auVar32._16_4_,
                                                  CONCAT412((uint)((byte)(uVar9 >> 3) & 1) *
                                                            auVar32._12_4_,
                                                            CONCAT48((uint)((byte)(uVar9 >> 2) & 1)
                                                                     * auVar32._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar9 >>
                                                                                           1) & 1) *
                                                                              auVar32._4_4_,
                                                                              (uint)(bVar4 & 1) *
                                                                              auVar32._0_4_)))))))),
                                   auVar34,1);
              auVar36 = vpmaxsd_avx512f(auVar36,auVar44);
            } while (uVar23 != 0);
            uVar31 = CONCAT11(bVar20,bVar4);
            auVar35 = vmovdqa32_avx512f(auVar36);
            auVar36._0_4_ =
                 (uint)(bVar4 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar44._0_4_;
            bVar5 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar36._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar44._4_4_;
            bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar36._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar44._8_4_;
            bVar5 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar36._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar44._12_4_;
            bVar5 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar36._16_4_ = (uint)bVar5 * auVar35._16_4_ | (uint)!bVar5 * auVar44._16_4_;
            bVar5 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar36._20_4_ = (uint)bVar5 * auVar35._20_4_ | (uint)!bVar5 * auVar44._20_4_;
            bVar5 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar36._24_4_ = (uint)bVar5 * auVar35._24_4_ | (uint)!bVar5 * auVar44._24_4_;
            bVar5 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar36._28_4_ = (uint)bVar5 * auVar35._28_4_ | (uint)!bVar5 * auVar44._28_4_;
            auVar36._32_4_ =
                 (uint)(bVar20 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar20 & 1) * auVar44._32_4_;
            bVar5 = (bool)(bVar20 >> 1 & 1);
            auVar36._36_4_ = (uint)bVar5 * auVar35._36_4_ | (uint)!bVar5 * auVar44._36_4_;
            bVar5 = (bool)(bVar20 >> 2 & 1);
            auVar36._40_4_ = (uint)bVar5 * auVar35._40_4_ | (uint)!bVar5 * auVar44._40_4_;
            bVar5 = (bool)(bVar20 >> 3 & 1);
            auVar36._44_4_ = (uint)bVar5 * auVar35._44_4_ | (uint)!bVar5 * auVar44._44_4_;
            bVar5 = (bool)(bVar20 >> 4 & 1);
            auVar36._48_4_ = (uint)bVar5 * auVar35._48_4_ | (uint)!bVar5 * auVar44._48_4_;
            bVar5 = (bool)(bVar20 >> 5 & 1);
            auVar36._52_4_ = (uint)bVar5 * auVar35._52_4_ | (uint)!bVar5 * auVar44._52_4_;
            bVar5 = (bool)(bVar20 >> 6 & 1);
            auVar36._56_4_ = (uint)bVar5 * auVar35._56_4_ | (uint)!bVar5 * auVar44._56_4_;
            auVar36._60_4_ =
                 (uint)(bVar20 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar20 >> 7) * auVar44._60_4_;
            auVar32 = vextracti64x4_avx512f(auVar36,1);
            auVar35 = vmovdqa32_avx512f(auVar42);
            auVar37._0_4_ =
                 (uint)(bVar4 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar43._0_4_;
            bVar5 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar37._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar43._4_4_;
            bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar37._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar43._8_4_;
            bVar5 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar37._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar43._12_4_;
            bVar5 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar37._16_4_ = (uint)bVar5 * auVar35._16_4_ | (uint)!bVar5 * auVar43._16_4_;
            bVar5 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar37._20_4_ = (uint)bVar5 * auVar35._20_4_ | (uint)!bVar5 * auVar43._20_4_;
            bVar5 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar37._24_4_ = (uint)bVar5 * auVar35._24_4_ | (uint)!bVar5 * auVar43._24_4_;
            bVar5 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar37._28_4_ = (uint)bVar5 * auVar35._28_4_ | (uint)!bVar5 * auVar43._28_4_;
            auVar37._32_4_ =
                 (uint)(bVar20 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar20 & 1) * auVar43._32_4_;
            bVar5 = (bool)(bVar20 >> 1 & 1);
            auVar37._36_4_ = (uint)bVar5 * auVar35._36_4_ | (uint)!bVar5 * auVar43._36_4_;
            bVar5 = (bool)(bVar20 >> 2 & 1);
            auVar37._40_4_ = (uint)bVar5 * auVar35._40_4_ | (uint)!bVar5 * auVar43._40_4_;
            bVar5 = (bool)(bVar20 >> 3 & 1);
            auVar37._44_4_ = (uint)bVar5 * auVar35._44_4_ | (uint)!bVar5 * auVar43._44_4_;
            bVar5 = (bool)(bVar20 >> 4 & 1);
            auVar37._48_4_ = (uint)bVar5 * auVar35._48_4_ | (uint)!bVar5 * auVar43._48_4_;
            bVar5 = (bool)(bVar20 >> 5 & 1);
            auVar37._52_4_ = (uint)bVar5 * auVar35._52_4_ | (uint)!bVar5 * auVar43._52_4_;
            bVar5 = (bool)(bVar20 >> 6 & 1);
            auVar37._56_4_ = (uint)bVar5 * auVar35._56_4_ | (uint)!bVar5 * auVar43._56_4_;
            auVar37._60_4_ =
                 (uint)(bVar20 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar20 >> 7) * auVar43._60_4_;
            auVar35 = vpmaxsd_avx512f(auVar36,ZEXT3264(auVar32));
            auVar6 = vpmaxsd_avx(auVar35._0_16_,auVar35._16_16_);
            auVar7 = vpshufd_avx(auVar6,0xee);
            auVar6 = vpmaxsd_avx(auVar6,auVar7);
            auVar7 = vpshufd_avx(auVar6,0x55);
            auVar6 = vpmaxsd_avx(auVar6,auVar7);
            uVar23 = (ulong)auVar6._0_4_;
            auVar32 = vextracti64x4_avx512f(auVar37,1);
            auVar35 = vpmaxsd_avx512f(auVar37,ZEXT3264(auVar32));
            auVar6 = vpmaxsd_avx(auVar35._0_16_,auVar35._16_16_);
            auVar7 = vpshufd_avx(auVar6,0xee);
            auVar6 = vpmaxsd_avx(auVar6,auVar7);
            auVar7 = vpshufd_avx(auVar6,0x55);
            auVar6 = vpmaxsd_avx(auVar6,auVar7);
            uVar24 = (ulong)auVar6._0_4_;
          }
          iVar14 = (int)uVar24;
          iVar10 = (int)uVar23;
          uVar25 = ((sVar13 - 1) + iVar14 * 8) / (uint)(iVar14 * 8);
          uVar15 = ((uVar12 - 1) + iVar10 * 8) / (uint)(iVar10 * 8);
          z->img_h_max = iVar14;
          z->img_v_max = iVar10;
          z->img_mcu_w = iVar14 * 8;
          z->img_mcu_h = iVar10 * 8;
          z->img_mcu_x = uVar25;
          z->img_mcu_y = uVar15;
          if (iVar16 < 1) {
            return 1;
          }
          lVar27 = 0;
          iVar16 = 1;
          while( true ) {
            iVar26 = *(int *)((long)&z->img_comp[0].h + lVar27);
            iVar21 = *(int *)((long)&z->img_comp[0].v + lVar27);
            *(int *)((long)&z->img_comp[0].x + lVar27) =
                 (int)((iVar26 * sVar13 + iVar14 + -1) / uVar24);
            iVar26 = iVar26 * uVar25;
            iVar29 = iVar21 * uVar15;
            a = iVar26 * 8;
            b = iVar29 * 8;
            *(int *)((long)&z->img_comp[0].y + lVar27) =
                 (int)((iVar21 * uVar12 + iVar10 + -1) / uVar23);
            *(int *)((long)&z->img_comp[0].w2 + lVar27) = a;
            *(int *)((long)&z->img_comp[0].h2 + lVar27) = b;
            pvVar18 = stbi__malloc_mad2(a,b,0xf);
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar27) = 0;
            *(undefined1 (*) [16])((long)&z->img_comp[0].raw_coeff + lVar27) = (undefined1  [16])0x0
            ;
            *(void **)((long)&z->img_comp[0].raw_data + lVar27) = pvVar18;
            iVar21 = extraout_EDX;
            if (pvVar18 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar27) =
                 (long)pvVar18 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar27) = iVar26;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar27) = iVar29;
              pvVar18 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar27) = pvVar18;
              iVar21 = extraout_EDX_00;
              if (pvVar18 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar27) =
                   (long)pvVar18 + 0xfU & 0xfffffffffffffff0;
            }
            lVar27 = lVar27 + 0x60;
            iVar16 = iVar16 + 1;
            if (uVar30 * 0x60 == lVar27) {
              return 1;
            }
          }
          stbi__g_failure_reason = "outofmem";
          stbi__free_jpeg_components(z,iVar16,iVar21);
          return 0;
        }
        goto LAB_0010d074;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar17 = s->buffer_start;
      iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
      if (iVar16 == 0) {
        s->read_from_callbacks = 0;
        psVar17 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar11 = '\0';
      }
      else {
        sVar11 = *psVar17;
        psVar17 = psVar17 + iVar16;
      }
      s->img_buffer_end = psVar17;
      s->img_buffer = s->buffer_start + 1;
      goto LAB_0010d0f4;
    }
    stbi__g_failure_reason = "only 8-bit";
  }
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}